

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

size_t __thiscall
pugi::xpath_query::evaluate_string(xpath_query *this,char_t *buffer,size_t capacity,xpath_node *n)

{
  undefined8 *puVar1;
  size_t sVar2;
  ulong uVar3;
  xpath_string r;
  xpath_context c;
  xpath_stack_data sd;
  xpath_string local_20c0;
  xpath_context local_20a8;
  xpath_stack_data local_2080;
  
  local_20a8.n._node._root = (n->_node)._root;
  local_20a8.n._attribute._attr = (n->_attribute)._attr;
  local_20a8.position = 1;
  local_20a8.size = 1;
  local_2080.stack.result = &local_2080.result;
  local_2080.result._error = &local_2080.oom;
  local_2080.result._root = local_2080.blocks;
  local_2080.result._root_size = 0;
  local_2080.stack.temp = &local_2080.temp;
  local_2080.temp._root = local_2080.blocks + 1;
  local_2080.temp._root_size = 0;
  local_2080.oom = false;
  local_2080.blocks[1].next = (xpath_memory_block *)0x0;
  local_2080.blocks[0].next = (xpath_memory_block *)0x0;
  local_2080.blocks[1].capacity = 0x1000;
  local_2080.blocks[0].capacity = 0x1000;
  local_2080.temp._error = local_2080.result._error;
  if ((undefined8 *)this->_impl == (undefined8 *)0x0) {
    local_20c0._buffer = "";
    local_20c0._uses_heap = false;
    local_20c0._length_heap = 0;
  }
  else {
    impl::anon_unknown_0::xpath_ast_node::eval_string
              (&local_20c0,*this->_impl,&local_20a8,&local_2080.stack);
    if ((local_2080.oom & 1U) != 0) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = getsockname;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  sVar2 = local_20c0._length_heap;
  if (local_20c0._uses_heap != true) {
    sVar2 = impl::anon_unknown_0::strlength(local_20c0._buffer);
  }
  uVar3 = sVar2 + 1;
  if (capacity != 0) {
    if (uVar3 == 0) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                    ,0x32ff,
                    "size_t pugi::xpath_query::evaluate_string(char_t *, size_t, const xpath_node &) const"
                   );
    }
    if (uVar3 < capacity) {
      capacity = uVar3;
    }
    memcpy(buffer,local_20c0._buffer,capacity - 1);
    buffer[capacity - 1] = '\0';
  }
  impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(&local_2080);
  return uVar3;
}

Assistant:

PUGI_IMPL_FN size_t xpath_query::evaluate_string(char_t* buffer, size_t capacity, const xpath_node& n) const
	{
		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_string r = _impl ? static_cast<impl::xpath_query_impl*>(_impl)->root->eval_string(c, sd.stack) : impl::xpath_string();

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			r = impl::xpath_string();
		#else
			throw std::bad_alloc();
		#endif
		}

		size_t full_size = r.length() + 1;

		if (capacity > 0)
		{
			size_t size = (full_size < capacity) ? full_size : capacity;
			assert(size > 0);

			memcpy(buffer, r.c_str(), (size - 1) * sizeof(char_t));
			buffer[size - 1] = 0;
		}

		return full_size;
	}